

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

void cmsys::SystemTools::SplitProgramFromArgs(string *path,string *program,string *args)

{
  pointer pcVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  undefined8 uVar7;
  ulong uVar8;
  char cVar9;
  string dir;
  string findProg;
  string tryProg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  e;
  long *local_c8 [2];
  long local_b8 [2];
  string local_a8;
  string local_88;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if ((path->_M_string_length != 0) && (iVar4 = access((path->_M_dataplus)._M_p,4), iVar4 == 0)) {
    std::__cxx11::string::_M_assign((string *)program);
    std::__cxx11::string::_M_replace((ulong)args,0,(char *)args->_M_string_length,0x1bb872);
    return;
  }
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FindProgram(&local_88,path,&local_48,false);
  if (local_88._M_string_length == 0) {
    local_c8[0] = local_b8;
    pcVar1 = (path->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c8,pcVar1,pcVar1 + path->_M_string_length);
    cVar9 = (char)local_c8;
    lVar5 = std::__cxx11::string::rfind(cVar9,0x20);
    do {
      if (lVar5 == -1) {
        std::__cxx11::string::_M_replace
                  ((ulong)program,0,(char *)program->_M_string_length,0x1bb872);
        std::__cxx11::string::_M_replace((ulong)args,0,(char *)args->_M_string_length,0x1bb872);
        break;
      }
      std::__cxx11::string::substr((ulong)&local_68,(ulong)local_c8);
      if ((local_68._M_string_length == 0) ||
         (iVar4 = access(local_68._M_dataplus._M_p,4), iVar4 != 0)) {
        FindProgram(&local_a8,&local_68,&local_48,false);
        std::__cxx11::string::operator=((string *)&local_88,(string *)&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if (local_88._M_string_length != 0) {
          std::__cxx11::string::_M_assign((string *)program);
          pcVar1 = (program->_M_dataplus)._M_p;
          uVar2 = program->_M_string_length;
          if (pcVar1[uVar2 - 1] == ' ') {
            pcVar6 = pcVar1 + (uVar2 - 1);
            do {
              uVar8 = uVar2 - 1;
              if (program->_M_string_length < uVar8) {
                std::__throw_out_of_range_fmt
                          ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                           "basic_string::erase");
                goto LAB_0013f50a;
              }
              program->_M_string_length = uVar8;
              *pcVar6 = '\0';
              pcVar6 = (program->_M_dataplus)._M_p + (uVar2 - 2);
              uVar2 = uVar8;
            } while (*pcVar6 == ' ');
          }
          std::__cxx11::string::substr((ulong)&local_a8,(ulong)local_c8);
          goto LAB_0013f3e0;
        }
        lVar5 = std::__cxx11::string::rfind(cVar9,0x20);
        bVar3 = true;
      }
      else {
        std::__cxx11::string::_M_assign((string *)program);
        pcVar1 = (program->_M_dataplus)._M_p;
        uVar2 = program->_M_string_length;
        if (pcVar1[uVar2 - 1] == ' ') {
          pcVar6 = pcVar1 + (uVar2 - 1);
          do {
            uVar8 = uVar2 - 1;
            if (program->_M_string_length < uVar8) {
LAB_0013f50a:
              uVar7 = std::__throw_out_of_range_fmt
                                ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                                 "basic_string::erase");
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p != &local_88.field_2) {
                operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1
                               );
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_48);
              _Unwind_Resume(uVar7);
            }
            program->_M_string_length = uVar8;
            *pcVar6 = '\0';
            pcVar6 = (program->_M_dataplus)._M_p + (uVar2 - 2);
            uVar2 = uVar8;
          } while (*pcVar6 == ' ');
        }
        std::__cxx11::string::substr((ulong)&local_a8,(ulong)local_c8);
LAB_0013f3e0:
        std::__cxx11::string::operator=((string *)args,(string *)&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        bVar3 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    } while (bVar3);
    if (local_c8[0] != local_b8) {
      operator_delete(local_c8[0],local_b8[0] + 1);
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)program);
    std::__cxx11::string::_M_replace((ulong)args,0,(char *)args->_M_string_length,0x1bb872);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void SystemTools::SplitProgramFromArgs(const kwsys_stl::string& path,
                                       kwsys_stl::string& program, kwsys_stl::string& args)
{
  // see if this is a full path to a program
  // if so then set program to path and args to nothing
  if(SystemTools::FileExists(path))
    {
    program = path;
    args = "";
    return;
    }
  // Try to find the program in the path, note the program
  // may have spaces in its name so we have to look for it
  kwsys_stl::vector<kwsys_stl::string> e;
  kwsys_stl::string findProg = SystemTools::FindProgram(path, e);
  if(!findProg.empty())
    {
    program = findProg;
    args = "";
    return;
    }

  // Now try and peel off space separated chunks from the end of the string
  // so the largest path possible is found allowing for spaces in the path
  kwsys_stl::string dir = path;
  kwsys_stl::string::size_type spacePos = dir.rfind(' ');
  while(spacePos != kwsys_stl::string::npos)
    {
    kwsys_stl::string tryProg = dir.substr(0, spacePos);
    // See if the file exists
    if(SystemTools::FileExists(tryProg))
      {
      program = tryProg;
      // remove trailing spaces from program
      kwsys_stl::string::size_type pos = program.size()-1;
      while(program[pos] == ' ')
        {
        program.erase(pos);
        pos--;
        }
      args = dir.substr(spacePos, dir.size()-spacePos);
      return;
      }
    // Now try and find the program in the path
    findProg = SystemTools::FindProgram(tryProg, e);
    if(!findProg.empty())
      {
      program = findProg;
      // remove trailing spaces from program
      kwsys_stl::string::size_type pos = program.size()-1;
      while(program[pos] == ' ')
        {
        program.erase(pos);
        pos--;
        }
      args = dir.substr(spacePos, dir.size()-spacePos);
      return;
      }
    // move past the space for the next search
    spacePos--;
    spacePos = dir.rfind(' ', spacePos);
    }

  program = "";
  args = "";
}